

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_basic_stats_merge
               (tsdn_t *tsdn,arena_t *arena,uint *nthreads,char **dss,ssize_t *dirty_decay_ms,
               ssize_t *muzzy_decay_ms,size_t *nactive,size_t *ndirty,size_t *nmuzzy)

{
  uint uVar1;
  dss_prec_t dVar2;
  ssize_t sVar3;
  size_t sVar4;
  undefined8 *in_RCX;
  int *in_RDX;
  arena_t *in_RSI;
  ssize_t *in_R8;
  ssize_t *in_R9;
  long *in_stack_00000008;
  long *in_stack_00000010;
  size_t result;
  
  uVar1 = arena_nthreads_get(in_RSI,false);
  *in_RDX = *in_RDX + uVar1;
  dVar2 = arena_dss_prec_get(in_RSI);
  *in_RCX = dss_prec_names[dVar2];
  sVar3 = arena_dirty_decay_ms_get((arena_t *)0x10f608);
  *in_R8 = sVar3;
  sVar3 = arena_muzzy_decay_ms_get((arena_t *)0x10f61d);
  *in_R9 = sVar3;
  *in_stack_00000008 = (in_RSI->nactive).repr + *in_stack_00000008;
  sVar4 = extents_npages_get(&in_RSI->extents_dirty);
  *in_stack_00000010 = sVar4 + *in_stack_00000010;
  sVar4 = extents_npages_get(&in_RSI->extents_muzzy);
  *muzzy_decay_ms = sVar4 + *muzzy_decay_ms;
  return;
}

Assistant:

void
arena_basic_stats_merge(tsdn_t *tsdn, arena_t *arena, unsigned *nthreads,
    const char **dss, ssize_t *dirty_decay_ms, ssize_t *muzzy_decay_ms,
    size_t *nactive, size_t *ndirty, size_t *nmuzzy) {
	*nthreads += arena_nthreads_get(arena, false);
	*dss = dss_prec_names[arena_dss_prec_get(arena)];
	*dirty_decay_ms = arena_dirty_decay_ms_get(arena);
	*muzzy_decay_ms = arena_muzzy_decay_ms_get(arena);
	*nactive += atomic_load_zu(&arena->nactive, ATOMIC_RELAXED);
	*ndirty += extents_npages_get(&arena->extents_dirty);
	*nmuzzy += extents_npages_get(&arena->extents_muzzy);
}